

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_TestParamSet.c
# Opt level: O0

void fiat_id_GostR3410_2001_TestParamSet_to_bytes(uint8_t *out1,uint64_t *arg1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *in_RSI;
  undefined1 *in_RDI;
  uint8_t x41;
  uint64_t x40;
  uint8_t x39;
  uint64_t x38;
  uint8_t x37;
  uint64_t x36;
  uint8_t x35;
  uint64_t x34;
  uint8_t x33;
  uint8_t x32;
  uint8_t x31;
  uint64_t x30;
  uint8_t x29;
  uint64_t x28;
  uint8_t x27;
  uint64_t x26;
  uint8_t x25;
  uint64_t x24;
  uint8_t x23;
  uint64_t x22;
  uint8_t x21;
  uint64_t x20;
  uint8_t x19;
  uint8_t x18;
  uint8_t x17;
  uint64_t x16;
  uint8_t x15;
  uint64_t x14;
  uint8_t x13;
  uint64_t x12;
  uint8_t x11;
  uint64_t x10;
  uint8_t x9;
  uint64_t x8;
  uint8_t x7;
  uint64_t x6;
  uint8_t x5;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  uint8_t x60;
  uint8_t x59;
  uint64_t x58;
  uint8_t x57;
  uint64_t x56;
  uint8_t x55;
  uint64_t x54;
  uint8_t x53;
  uint64_t x52;
  uint8_t x51;
  uint64_t x50;
  uint8_t x49;
  uint64_t x48;
  uint8_t x47;
  uint8_t x46;
  uint8_t x45;
  uint64_t x44;
  uint8_t x43;
  uint64_t x42;
  
  uVar1 = in_RSI[3];
  uVar2 = in_RSI[2];
  uVar3 = in_RSI[1];
  uVar4 = *in_RSI;
  *in_RDI = (char)uVar4;
  in_RDI[1] = (char)((ulong)uVar4 >> 8);
  in_RDI[2] = (char)((ulong)uVar4 >> 0x10);
  in_RDI[3] = (char)((ulong)uVar4 >> 0x18);
  in_RDI[4] = (char)((ulong)uVar4 >> 0x20);
  in_RDI[5] = (char)((ulong)uVar4 >> 0x28);
  in_RDI[6] = (char)((ulong)uVar4 >> 0x30);
  in_RDI[7] = (char)((ulong)uVar4 >> 0x38);
  in_RDI[8] = (char)uVar3;
  in_RDI[9] = (char)((ulong)uVar3 >> 8);
  in_RDI[10] = (char)((ulong)uVar3 >> 0x10);
  in_RDI[0xb] = (char)((ulong)uVar3 >> 0x18);
  in_RDI[0xc] = (char)((ulong)uVar3 >> 0x20);
  in_RDI[0xd] = (char)((ulong)uVar3 >> 0x28);
  in_RDI[0xe] = (char)((ulong)uVar3 >> 0x30);
  in_RDI[0xf] = (char)((ulong)uVar3 >> 0x38);
  in_RDI[0x10] = (char)uVar2;
  in_RDI[0x11] = (char)((ulong)uVar2 >> 8);
  in_RDI[0x12] = (char)((ulong)uVar2 >> 0x10);
  in_RDI[0x13] = (char)((ulong)uVar2 >> 0x18);
  in_RDI[0x14] = (char)((ulong)uVar2 >> 0x20);
  in_RDI[0x15] = (char)((ulong)uVar2 >> 0x28);
  in_RDI[0x16] = (char)((ulong)uVar2 >> 0x30);
  in_RDI[0x17] = (char)((ulong)uVar2 >> 0x38);
  in_RDI[0x18] = (char)uVar1;
  in_RDI[0x19] = (char)((ulong)uVar1 >> 8);
  in_RDI[0x1a] = (char)((ulong)uVar1 >> 0x10);
  in_RDI[0x1b] = (char)((ulong)uVar1 >> 0x18);
  in_RDI[0x1c] = (char)((ulong)uVar1 >> 0x20);
  in_RDI[0x1d] = (char)((ulong)uVar1 >> 0x28);
  in_RDI[0x1e] = (char)((ulong)uVar1 >> 0x30);
  in_RDI[0x1f] = (char)((ulong)uVar1 >> 0x38);
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_TestParamSet_to_bytes(
    uint8_t out1[32], const uint64_t arg1[4]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint8_t x5;
    uint64_t x6;
    uint8_t x7;
    uint64_t x8;
    uint8_t x9;
    uint64_t x10;
    uint8_t x11;
    uint64_t x12;
    uint8_t x13;
    uint64_t x14;
    uint8_t x15;
    uint64_t x16;
    uint8_t x17;
    uint8_t x18;
    uint8_t x19;
    uint64_t x20;
    uint8_t x21;
    uint64_t x22;
    uint8_t x23;
    uint64_t x24;
    uint8_t x25;
    uint64_t x26;
    uint8_t x27;
    uint64_t x28;
    uint8_t x29;
    uint64_t x30;
    uint8_t x31;
    uint8_t x32;
    uint8_t x33;
    uint64_t x34;
    uint8_t x35;
    uint64_t x36;
    uint8_t x37;
    uint64_t x38;
    uint8_t x39;
    uint64_t x40;
    uint8_t x41;
    uint64_t x42;
    uint8_t x43;
    uint64_t x44;
    uint8_t x45;
    uint8_t x46;
    uint8_t x47;
    uint64_t x48;
    uint8_t x49;
    uint64_t x50;
    uint8_t x51;
    uint64_t x52;
    uint8_t x53;
    uint64_t x54;
    uint8_t x55;
    uint64_t x56;
    uint8_t x57;
    uint64_t x58;
    uint8_t x59;
    uint8_t x60;
    x1 = (arg1[3]);
    x2 = (arg1[2]);
    x3 = (arg1[1]);
    x4 = (arg1[0]);
    x5 = (uint8_t)(x4 & UINT8_C(0xff));
    x6 = (x4 >> 8);
    x7 = (uint8_t)(x6 & UINT8_C(0xff));
    x8 = (x6 >> 8);
    x9 = (uint8_t)(x8 & UINT8_C(0xff));
    x10 = (x8 >> 8);
    x11 = (uint8_t)(x10 & UINT8_C(0xff));
    x12 = (x10 >> 8);
    x13 = (uint8_t)(x12 & UINT8_C(0xff));
    x14 = (x12 >> 8);
    x15 = (uint8_t)(x14 & UINT8_C(0xff));
    x16 = (x14 >> 8);
    x17 = (uint8_t)(x16 & UINT8_C(0xff));
    x18 = (uint8_t)(x16 >> 8);
    x19 = (uint8_t)(x3 & UINT8_C(0xff));
    x20 = (x3 >> 8);
    x21 = (uint8_t)(x20 & UINT8_C(0xff));
    x22 = (x20 >> 8);
    x23 = (uint8_t)(x22 & UINT8_C(0xff));
    x24 = (x22 >> 8);
    x25 = (uint8_t)(x24 & UINT8_C(0xff));
    x26 = (x24 >> 8);
    x27 = (uint8_t)(x26 & UINT8_C(0xff));
    x28 = (x26 >> 8);
    x29 = (uint8_t)(x28 & UINT8_C(0xff));
    x30 = (x28 >> 8);
    x31 = (uint8_t)(x30 & UINT8_C(0xff));
    x32 = (uint8_t)(x30 >> 8);
    x33 = (uint8_t)(x2 & UINT8_C(0xff));
    x34 = (x2 >> 8);
    x35 = (uint8_t)(x34 & UINT8_C(0xff));
    x36 = (x34 >> 8);
    x37 = (uint8_t)(x36 & UINT8_C(0xff));
    x38 = (x36 >> 8);
    x39 = (uint8_t)(x38 & UINT8_C(0xff));
    x40 = (x38 >> 8);
    x41 = (uint8_t)(x40 & UINT8_C(0xff));
    x42 = (x40 >> 8);
    x43 = (uint8_t)(x42 & UINT8_C(0xff));
    x44 = (x42 >> 8);
    x45 = (uint8_t)(x44 & UINT8_C(0xff));
    x46 = (uint8_t)(x44 >> 8);
    x47 = (uint8_t)(x1 & UINT8_C(0xff));
    x48 = (x1 >> 8);
    x49 = (uint8_t)(x48 & UINT8_C(0xff));
    x50 = (x48 >> 8);
    x51 = (uint8_t)(x50 & UINT8_C(0xff));
    x52 = (x50 >> 8);
    x53 = (uint8_t)(x52 & UINT8_C(0xff));
    x54 = (x52 >> 8);
    x55 = (uint8_t)(x54 & UINT8_C(0xff));
    x56 = (x54 >> 8);
    x57 = (uint8_t)(x56 & UINT8_C(0xff));
    x58 = (x56 >> 8);
    x59 = (uint8_t)(x58 & UINT8_C(0xff));
    x60 = (uint8_t)(x58 >> 8);
    out1[0] = x5;
    out1[1] = x7;
    out1[2] = x9;
    out1[3] = x11;
    out1[4] = x13;
    out1[5] = x15;
    out1[6] = x17;
    out1[7] = x18;
    out1[8] = x19;
    out1[9] = x21;
    out1[10] = x23;
    out1[11] = x25;
    out1[12] = x27;
    out1[13] = x29;
    out1[14] = x31;
    out1[15] = x32;
    out1[16] = x33;
    out1[17] = x35;
    out1[18] = x37;
    out1[19] = x39;
    out1[20] = x41;
    out1[21] = x43;
    out1[22] = x45;
    out1[23] = x46;
    out1[24] = x47;
    out1[25] = x49;
    out1[26] = x51;
    out1[27] = x53;
    out1[28] = x55;
    out1[29] = x57;
    out1[30] = x59;
    out1[31] = x60;
}